

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
emplace<QTextBrowserPrivate::HistoryEntry_const&>
          (QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *this,qsizetype i,HistoryEntry *args)

{
  HistoryEntry **ppHVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  HistoryEntry *pHVar5;
  Data *pDVar6;
  HistoryEntry *pHVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  HistoryEntry tmp;
  QUrl local_78;
  Data *pDStack_70;
  char16_t *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
           super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b12a6:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_70 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&local_78,&args->url);
    pDStack_70 = (args->title).d.d;
    local_68 = (args->title).d.ptr;
    puStack_60 = (undefined1 *)(args->title).d.size;
    if (pDStack_70 != (Data *)0x0) {
      LOCK();
      (pDStack_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDStack_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48 = (undefined1 *)CONCAT44(local_48._4_4_,args->type);
    local_58._0_4_ = args->hpos;
    local_58._4_4_ = args->vpos;
    puStack_50._0_4_ = args->focusIndicatorPosition;
    puStack_50._4_4_ = args->focusIndicatorAnchor;
    bVar11 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
             super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size != 0;
    QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::detachAndGrow
              ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this,(uint)(i == 0 && bVar11)
               ,1,(HistoryEntry **)0x0,(QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x0);
    pHVar5 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
             super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
    if (i == 0 && bVar11) {
      pHVar5[-1].url.d = local_78.d;
      pHVar5[-1].title.d.d = pDStack_70;
      pHVar5[-1].title.d.ptr = local_68;
      pHVar5[-1].title.d.size = (qsizetype)puStack_60;
      *(undefined1 **)&pHVar5[-1].hpos = local_58;
      *(undefined1 **)&pHVar5[-1].focusIndicatorPosition = puStack_50;
      pHVar5[-1].type = (ResourceType)local_48;
      ppHVar1 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                 super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
      *ppHVar1 = *ppHVar1 + -1;
    }
    else {
      pHVar7 = pHVar5 + i;
      memmove(pHVar7 + 1,pHVar5 + i,
              ((this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
               super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size - i) * 0x38);
      (pHVar7->url).d = local_78.d;
      (pHVar7->title).d.d = pDStack_70;
      (pHVar7->title).d.ptr = local_68;
      (pHVar7->title).d.size = (qsizetype)puStack_60;
      *(undefined1 **)&pHVar7->hpos = local_58;
      *(undefined1 **)&pHVar7->focusIndicatorPosition = puStack_50;
      pHVar7->type = (ResourceType)local_48;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
              super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size;
    *pqVar2 = *pqVar2 + 1;
    puStack_60 = (undefined1 *)0x0;
    local_68 = (char16_t *)0x0;
    pDStack_70 = (Data *)0x0;
    local_78.d = (QUrlPrivate *)0x0;
    QUrl::~QUrl(&local_78);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
            super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                      super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pHVar7 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
               super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
      pHVar5 = pHVar7 + lVar4;
      QUrl::QUrl(&pHVar5->url,&args->url);
      pDVar6 = (args->title).d.d;
      pHVar7[lVar4].title.d.d = pDVar6;
      pHVar7[lVar4].title.d.ptr = (args->title).d.ptr;
      pHVar7[lVar4].title.d.size = (args->title).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pHVar5->type = args->type;
      iVar8 = args->vpos;
      iVar9 = args->focusIndicatorPosition;
      iVar10 = args->focusIndicatorAnchor;
      pHVar5->hpos = args->hpos;
      pHVar5->vpos = iVar8;
      pHVar5->focusIndicatorPosition = iVar9;
      pHVar5->focusIndicatorAnchor = iVar10;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((HistoryEntry *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
          super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr)) goto LAB_004b12a6;
      pHVar5 = (this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
               super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
      QUrl::QUrl(&pHVar5[-1].url,&args->url);
      pDVar6 = (args->title).d.d;
      pHVar5[-1].title.d.d = pDVar6;
      pHVar5[-1].title.d.ptr = (args->title).d.ptr;
      pHVar5[-1].title.d.size = (args->title).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pHVar5[-1].type = args->type;
      iVar8 = args->vpos;
      iVar9 = args->focusIndicatorPosition;
      iVar10 = args->focusIndicatorAnchor;
      pHVar5[-1].hpos = args->hpos;
      pHVar5[-1].vpos = iVar8;
      pHVar5[-1].focusIndicatorPosition = iVar9;
      pHVar5[-1].focusIndicatorAnchor = iVar10;
      ppHVar1 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
                 super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.ptr;
      *ppHVar1 = *ppHVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>).
              super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }